

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int update_timer(Curl_multi *multi)

{
  CURLMcode CVar1;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  long timeout_ms;
  Curl_multi *multi_local;
  
  if (multi->timer_cb == (curl_multi_timer_callback)0x0) {
    multi_local._4_4_ = 0;
  }
  else {
    timeout_ms = (long)multi;
    CVar1 = multi_timeout(multi,&local_20);
    if (CVar1 == CURLM_OK) {
      if (local_20 < 0) {
        if ((((*(long *)(timeout_ms + 0x1d0) < 1) && (-1 < *(long *)(timeout_ms + 0x1d0))) &&
            (*(long *)(timeout_ms + 0x1d8) < 1)) && (-1 < *(long *)(timeout_ms + 0x1d8))) {
          multi_local._4_4_ = 0;
        }
        else {
          *(__time_t *)(timeout_ms + 0x1d0) = 0;
          *(__suseconds_t *)(timeout_ms + 0x1d8) = 0;
          multi_local._4_4_ =
               (**(code **)(timeout_ms + 0x1c0))
                         (timeout_ms,0xffffffffffffffff,*(undefined8 *)(timeout_ms + 0x1c8));
        }
      }
      else {
        if (*(long *)(*(long *)(timeout_ms + 0xb0) + 0x20) < *(long *)(timeout_ms + 0x1d0)) {
          local_24 = 0xffffffff;
        }
        else {
          if (*(long *)(timeout_ms + 0x1d0) < *(long *)(*(long *)(timeout_ms + 0xb0) + 0x20)) {
            local_28 = 1;
          }
          else {
            if (*(long *)(*(long *)(timeout_ms + 0xb0) + 0x28) < *(long *)(timeout_ms + 0x1d8)) {
              local_2c = 0xffffffff;
            }
            else {
              local_2c = (uint)(*(long *)(timeout_ms + 0x1d8) <
                               *(long *)(*(long *)(timeout_ms + 0xb0) + 0x28));
            }
            local_28 = local_2c;
          }
          local_24 = local_28;
        }
        if (local_24 == 0) {
          multi_local._4_4_ = 0;
        }
        else {
          *(undefined8 *)(timeout_ms + 0x1d0) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x20)
          ;
          *(undefined8 *)(timeout_ms + 0x1d8) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x28)
          ;
          multi_local._4_4_ =
               (**(code **)(timeout_ms + 0x1c0))
                         (timeout_ms,local_20,*(undefined8 *)(timeout_ms + 0x1c8));
        }
      }
    }
    else {
      multi_local._4_4_ = -1;
    }
  }
  return multi_local._4_4_;
}

Assistant:

static int update_timer(struct Curl_multi *multi)
{
  long timeout_ms;

  if(!multi->timer_cb)
    return 0;
  if(multi_timeout(multi, &timeout_ms)) {
    return -1;
  }
  if(timeout_ms < 0) {
    static const struct timeval none={0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      return multi->timer_cb(multi, -1, multi->timer_userp);
    }
    return 0;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return 0;

  multi->timer_lastcall = multi->timetree->key;

  return multi->timer_cb(multi, timeout_ms, multi->timer_userp);
}